

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O2

void ga_sort_scat(Integer *pn,void *v,Integer *i,Integer *j,Integer *base,Integer type)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  int iVar4;
  undefined8 uVar5;
  Integer IVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long *plVar9;
  long *plVar10;
  long *plVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long *plVar16;
  Integer *pIVar17;
  long lVar18;
  long lVar19;
  DoubleComplex dtmp;
  
  switch(type) {
  case 0x3e9:
    uVar13 = *pn;
    if (1 < (long)uVar13) {
      uVar12 = uVar13 >> 1;
      plVar9 = base + uVar12 * 2 + ((ulong)((uint)uVar13 & 1) - 1);
      for (; uVar12 != 1; uVar12 = uVar12 - 1) {
        uVar13 = uVar12;
        plVar16 = base + (uVar12 - 1);
        while (plVar11 = plVar16 + uVar13, plVar11 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar11 == plVar9) {
            lVar14 = *plVar9;
            plVar10 = plVar9;
          }
          else {
            lVar15 = *plVar11;
            lVar18 = plVar11[1];
            lVar14 = lVar15;
            if (lVar15 < lVar18) {
              lVar14 = lVar18;
            }
            plVar10 = plVar11 + 1;
            if (lVar18 <= lVar15) {
              plVar10 = plVar11;
            }
            uVar13 = uVar13 | lVar15 < lVar18;
          }
          lVar15 = *plVar16;
          if (lVar14 <= lVar15) break;
          lVar18 = (long)plVar10 - (long)base;
          *plVar16 = lVar14;
          lVar14 = (long)plVar16 - (long)base;
          *plVar10 = (long)(int)lVar15;
          uVar3 = *(undefined4 *)((long)v + (lVar14 >> 1));
          *(undefined4 *)((long)v + (lVar14 >> 1)) = *(undefined4 *)((long)v + (lVar18 >> 1));
          *(undefined4 *)((long)v + (lVar18 >> 1)) = uVar3;
          iVar4 = *(int *)((long)i + lVar14);
          *(undefined8 *)((long)i + lVar14) = *(undefined8 *)((long)i + lVar18);
          *(long *)((long)i + lVar18) = (long)iVar4;
          iVar4 = *(int *)((long)j + lVar14);
          *(undefined8 *)((long)j + lVar14) = *(undefined8 *)((long)j + lVar18);
          *(long *)((long)j + lVar18) = (long)iVar4;
          plVar16 = plVar10;
        }
      }
      for (; lVar14 = (long)plVar9 - (long)base, lVar14 != 0; plVar9 = plVar9 + -1) {
        uVar13 = 1;
        pIVar17 = base;
        while (plVar16 = pIVar17 + uVar13, plVar16 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar16 == plVar9) {
            lVar15 = *plVar9;
            plVar11 = plVar9;
          }
          else {
            lVar18 = *plVar16;
            lVar19 = plVar16[1];
            lVar15 = lVar18;
            if (lVar18 < lVar19) {
              lVar15 = lVar19;
            }
            plVar11 = plVar16 + 1;
            if (lVar19 <= lVar18) {
              plVar11 = plVar16;
            }
            uVar13 = uVar13 | lVar18 < lVar19;
          }
          lVar18 = *pIVar17;
          if (lVar15 <= lVar18) break;
          lVar19 = (long)plVar11 - (long)base;
          *pIVar17 = lVar15;
          lVar15 = (long)pIVar17 - (long)base;
          *plVar11 = (long)(int)lVar18;
          uVar3 = *(undefined4 *)((long)v + (lVar15 >> 1));
          *(undefined4 *)((long)v + (lVar15 >> 1)) = *(undefined4 *)((long)v + (lVar19 >> 1));
          *(undefined4 *)((long)v + (lVar19 >> 1)) = uVar3;
          iVar4 = *(int *)((long)i + lVar15);
          *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar19);
          *(long *)((long)i + lVar19) = (long)iVar4;
          iVar4 = *(int *)((long)j + lVar15);
          *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar19);
          *(long *)((long)j + lVar19) = (long)iVar4;
          pIVar17 = plVar11;
        }
        IVar6 = *base;
        *base = *plVar9;
        *plVar9 = (long)(int)IVar6;
        uVar3 = *v;
        *(undefined4 *)v = *(undefined4 *)((long)v + (lVar14 >> 1));
        *(undefined4 *)((long)v + (lVar14 >> 1)) = uVar3;
        IVar6 = *i;
        *i = *(Integer *)((long)i + lVar14);
        *(long *)((long)i + lVar14) = (long)(int)IVar6;
        IVar6 = *j;
        *j = *(Integer *)((long)j + lVar14);
        *(long *)((long)j + lVar14) = (long)(int)IVar6;
      }
    }
    break;
  case 0x3ea:
    uVar13 = *pn;
    if (1 < (long)uVar13) {
      uVar12 = uVar13 >> 1;
      plVar9 = base + uVar12 * 2 + ((ulong)((uint)uVar13 & 1) - 1);
      for (; uVar12 != 1; uVar12 = uVar12 - 1) {
        uVar13 = uVar12;
        plVar16 = base + (uVar12 - 1);
        while (plVar11 = plVar16 + uVar13, plVar11 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar11 == plVar9) {
            lVar14 = *plVar9;
            plVar10 = plVar9;
          }
          else {
            lVar15 = *plVar11;
            lVar18 = plVar11[1];
            lVar14 = lVar15;
            if (lVar15 < lVar18) {
              lVar14 = lVar18;
            }
            plVar10 = plVar11 + 1;
            if (lVar18 <= lVar15) {
              plVar10 = plVar11;
            }
            uVar13 = uVar13 | lVar15 < lVar18;
          }
          lVar15 = *plVar16;
          if (lVar14 <= lVar15) break;
          lVar18 = (long)plVar10 - (long)base;
          *plVar16 = lVar14;
          lVar14 = (long)plVar16 - (long)base;
          *plVar10 = lVar15;
          uVar5 = *(undefined8 *)((long)v + lVar14);
          *(undefined8 *)((long)v + lVar14) = *(undefined8 *)((long)v + lVar18);
          *(undefined8 *)((long)v + lVar18) = uVar5;
          uVar5 = *(undefined8 *)((long)i + lVar14);
          *(undefined8 *)((long)i + lVar14) = *(undefined8 *)((long)i + lVar18);
          *(undefined8 *)((long)i + lVar18) = uVar5;
          uVar5 = *(undefined8 *)((long)j + lVar14);
          *(undefined8 *)((long)j + lVar14) = *(undefined8 *)((long)j + lVar18);
          *(undefined8 *)((long)j + lVar18) = uVar5;
          plVar16 = plVar10;
        }
      }
      for (; lVar14 = (long)plVar9 - (long)base, lVar14 != 0; plVar9 = plVar9 + -1) {
        uVar13 = 1;
        pIVar17 = base;
        while (plVar16 = pIVar17 + uVar13, plVar16 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar16 == plVar9) {
            lVar15 = *plVar9;
            plVar11 = plVar9;
          }
          else {
            lVar18 = *plVar16;
            lVar19 = plVar16[1];
            lVar15 = lVar18;
            if (lVar18 < lVar19) {
              lVar15 = lVar19;
            }
            plVar11 = plVar16 + 1;
            if (lVar19 <= lVar18) {
              plVar11 = plVar16;
            }
            uVar13 = uVar13 | lVar18 < lVar19;
          }
          lVar18 = *pIVar17;
          if (lVar15 <= lVar18) break;
          lVar19 = (long)plVar11 - (long)base;
          *pIVar17 = lVar15;
          lVar15 = (long)pIVar17 - (long)base;
          *plVar11 = lVar18;
          uVar5 = *(undefined8 *)((long)v + lVar15);
          *(undefined8 *)((long)v + lVar15) = *(undefined8 *)((long)v + lVar19);
          *(undefined8 *)((long)v + lVar19) = uVar5;
          uVar5 = *(undefined8 *)((long)i + lVar15);
          *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar19);
          *(undefined8 *)((long)i + lVar19) = uVar5;
          uVar5 = *(undefined8 *)((long)j + lVar15);
          *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar19);
          *(undefined8 *)((long)j + lVar19) = uVar5;
          pIVar17 = plVar11;
        }
        lVar15 = *base;
        *base = *plVar9;
        *plVar9 = lVar15;
        uVar5 = *v;
        *(undefined8 *)v = *(undefined8 *)((long)v + lVar14);
        *(undefined8 *)((long)v + lVar14) = uVar5;
        IVar6 = *i;
        *i = *(Integer *)((long)i + lVar14);
        *(Integer *)((long)i + lVar14) = IVar6;
        IVar6 = *j;
        *j = *(Integer *)((long)j + lVar14);
        *(Integer *)((long)j + lVar14) = IVar6;
      }
    }
    break;
  case 0x3eb:
    uVar13 = *pn;
    if (1 < (long)uVar13) {
      uVar12 = uVar13 >> 1;
      plVar9 = base + uVar12 * 2 + ((ulong)((uint)uVar13 & 1) - 1);
      for (; uVar12 != 1; uVar12 = uVar12 - 1) {
        uVar13 = uVar12;
        plVar16 = base + (uVar12 - 1);
        while (plVar11 = plVar16 + uVar13, plVar11 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar11 == plVar9) {
            lVar14 = *plVar9;
            plVar10 = plVar9;
          }
          else {
            lVar15 = *plVar11;
            lVar18 = plVar11[1];
            lVar14 = lVar15;
            if (lVar15 < lVar18) {
              lVar14 = lVar18;
            }
            plVar10 = plVar11 + 1;
            if (lVar18 <= lVar15) {
              plVar10 = plVar11;
            }
            uVar13 = uVar13 | lVar15 < lVar18;
          }
          lVar15 = *plVar16;
          if (lVar14 <= lVar15) break;
          *plVar16 = lVar14;
          *plVar10 = lVar15;
          lVar14 = (long)(int)((ulong)((long)plVar16 - (long)base) >> 3);
          uVar3 = *(undefined4 *)((long)v + lVar14 * 4);
          lVar15 = (long)(int)((ulong)((long)plVar10 - (long)base) >> 3);
          *(undefined4 *)((long)v + lVar14 * 4) = *(undefined4 *)((long)v + lVar15 * 4);
          *(undefined4 *)((long)v + lVar15 * 4) = uVar3;
          IVar6 = i[lVar14];
          i[lVar14] = i[lVar15];
          i[lVar15] = IVar6;
          IVar6 = j[lVar14];
          j[lVar14] = j[lVar15];
          j[lVar15] = IVar6;
          plVar16 = plVar10;
        }
      }
      for (; (long)plVar9 - (long)base != 0; plVar9 = plVar9 + -1) {
        uVar13 = 1;
        pIVar17 = base;
        while (plVar16 = pIVar17 + uVar13, plVar16 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar16 == plVar9) {
            lVar14 = *plVar9;
            plVar11 = plVar9;
          }
          else {
            lVar15 = *plVar16;
            lVar18 = plVar16[1];
            lVar14 = lVar15;
            if (lVar15 < lVar18) {
              lVar14 = lVar18;
            }
            plVar11 = plVar16 + 1;
            if (lVar18 <= lVar15) {
              plVar11 = plVar16;
            }
            uVar13 = uVar13 | lVar15 < lVar18;
          }
          lVar15 = *pIVar17;
          if (lVar14 <= lVar15) break;
          *pIVar17 = lVar14;
          *plVar11 = lVar15;
          lVar14 = (long)(int)((ulong)((long)pIVar17 - (long)base) >> 3);
          uVar3 = *(undefined4 *)((long)v + lVar14 * 4);
          lVar15 = (long)(int)((ulong)((long)plVar11 - (long)base) >> 3);
          *(undefined4 *)((long)v + lVar14 * 4) = *(undefined4 *)((long)v + lVar15 * 4);
          *(undefined4 *)((long)v + lVar15 * 4) = uVar3;
          IVar6 = i[lVar14];
          i[lVar14] = i[lVar15];
          i[lVar15] = IVar6;
          IVar6 = j[lVar14];
          j[lVar14] = j[lVar15];
          j[lVar15] = IVar6;
          pIVar17 = plVar11;
        }
        lVar14 = *base;
        *base = *plVar9;
        *plVar9 = lVar14;
        uVar3 = *v;
        lVar14 = (long)(int)((ulong)((long)plVar9 - (long)base) >> 3);
        *(undefined4 *)v = *(undefined4 *)((long)v + lVar14 * 4);
        *(undefined4 *)((long)v + lVar14 * 4) = uVar3;
        IVar6 = *i;
        *i = i[lVar14];
        i[lVar14] = IVar6;
        IVar6 = *j;
        *j = j[lVar14];
        j[lVar14] = IVar6;
      }
    }
    break;
  case 0x3ec:
    uVar13 = *pn;
    if (1 < (long)uVar13) {
      uVar12 = uVar13 >> 1;
      plVar9 = base + uVar12 * 2 + ((ulong)((uint)uVar13 & 1) - 1);
      for (; uVar12 != 1; uVar12 = uVar12 - 1) {
        uVar13 = uVar12;
        plVar16 = base + (uVar12 - 1);
        while (plVar11 = plVar16 + uVar13, plVar11 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar11 == plVar9) {
            lVar14 = *plVar9;
            plVar10 = plVar9;
          }
          else {
            lVar15 = *plVar11;
            lVar18 = plVar11[1];
            lVar14 = lVar15;
            if (lVar15 < lVar18) {
              lVar14 = lVar18;
            }
            plVar10 = plVar11 + 1;
            if (lVar18 <= lVar15) {
              plVar10 = plVar11;
            }
            uVar13 = uVar13 | lVar15 < lVar18;
          }
          lVar15 = *plVar16;
          if (lVar14 <= lVar15) break;
          lVar18 = (long)plVar10 - (long)base;
          *plVar16 = lVar14;
          lVar14 = (long)plVar16 - (long)base;
          *plVar10 = lVar15;
          uVar5 = *(undefined8 *)((long)v + lVar14);
          *(undefined8 *)((long)v + lVar14) = *(undefined8 *)((long)v + lVar18);
          *(undefined8 *)((long)v + lVar18) = uVar5;
          uVar5 = *(undefined8 *)((long)i + lVar14);
          *(undefined8 *)((long)i + lVar14) = *(undefined8 *)((long)i + lVar18);
          *(undefined8 *)((long)i + lVar18) = uVar5;
          uVar5 = *(undefined8 *)((long)j + lVar14);
          *(undefined8 *)((long)j + lVar14) = *(undefined8 *)((long)j + lVar18);
          *(undefined8 *)((long)j + lVar18) = uVar5;
          plVar16 = plVar10;
        }
      }
      for (; lVar14 = (long)plVar9 - (long)base, lVar14 != 0; plVar9 = plVar9 + -1) {
        uVar13 = 1;
        pIVar17 = base;
        while (plVar16 = pIVar17 + uVar13, plVar16 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar16 == plVar9) {
            lVar15 = *plVar9;
            plVar11 = plVar9;
          }
          else {
            lVar18 = *plVar16;
            lVar19 = plVar16[1];
            lVar15 = lVar18;
            if (lVar18 < lVar19) {
              lVar15 = lVar19;
            }
            plVar11 = plVar16 + 1;
            if (lVar19 <= lVar18) {
              plVar11 = plVar16;
            }
            uVar13 = uVar13 | lVar18 < lVar19;
          }
          lVar18 = *pIVar17;
          if (lVar15 <= lVar18) break;
          lVar19 = (long)plVar11 - (long)base;
          *pIVar17 = lVar15;
          lVar15 = (long)pIVar17 - (long)base;
          *plVar11 = lVar18;
          uVar5 = *(undefined8 *)((long)v + lVar15);
          *(undefined8 *)((long)v + lVar15) = *(undefined8 *)((long)v + lVar19);
          *(undefined8 *)((long)v + lVar19) = uVar5;
          uVar5 = *(undefined8 *)((long)i + lVar15);
          *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar19);
          *(undefined8 *)((long)i + lVar19) = uVar5;
          uVar5 = *(undefined8 *)((long)j + lVar15);
          *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar19);
          *(undefined8 *)((long)j + lVar19) = uVar5;
          pIVar17 = plVar11;
        }
        lVar15 = *base;
        *base = *plVar9;
        *plVar9 = lVar15;
        uVar5 = *v;
        *(undefined8 *)v = *(undefined8 *)((long)v + lVar14);
        *(undefined8 *)((long)v + lVar14) = uVar5;
        IVar6 = *i;
        *i = *(Integer *)((long)i + lVar14);
        *(Integer *)((long)i + lVar14) = IVar6;
        IVar6 = *j;
        *j = *(Integer *)((long)j + lVar14);
        *(Integer *)((long)j + lVar14) = IVar6;
      }
    }
    break;
  default:
    pnga_error("ERROR:ga_sort_scat: wrong type",type);
    return;
  case 0x3ee:
    uVar13 = *pn;
    if (1 < (long)uVar13) {
      uVar12 = uVar13 >> 1;
      plVar9 = base + uVar12 * 2 + ((ulong)((uint)uVar13 & 1) - 1);
      for (; uVar12 != 1; uVar12 = uVar12 - 1) {
        uVar13 = uVar12;
        plVar16 = base + (uVar12 - 1);
        while (plVar11 = plVar16 + uVar13, plVar11 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar11 == plVar9) {
            lVar14 = *plVar9;
            plVar10 = plVar9;
          }
          else {
            lVar15 = *plVar11;
            lVar18 = plVar11[1];
            lVar14 = lVar15;
            if (lVar15 < lVar18) {
              lVar14 = lVar18;
            }
            plVar10 = plVar11 + 1;
            if (lVar18 <= lVar15) {
              plVar10 = plVar11;
            }
            uVar13 = uVar13 | lVar15 < lVar18;
          }
          lVar15 = *plVar16;
          if (lVar14 <= lVar15) break;
          lVar18 = (long)plVar10 - (long)base;
          *plVar16 = lVar14;
          lVar14 = (long)plVar16 - (long)base;
          *plVar10 = lVar15;
          uVar5 = *(undefined8 *)((long)v + lVar14);
          *(undefined8 *)((long)v + lVar14) = *(undefined8 *)((long)v + lVar18);
          *(undefined8 *)((long)v + lVar18) = uVar5;
          uVar5 = *(undefined8 *)((long)i + lVar14);
          *(undefined8 *)((long)i + lVar14) = *(undefined8 *)((long)i + lVar18);
          *(undefined8 *)((long)i + lVar18) = uVar5;
          uVar5 = *(undefined8 *)((long)j + lVar14);
          *(undefined8 *)((long)j + lVar14) = *(undefined8 *)((long)j + lVar18);
          *(undefined8 *)((long)j + lVar18) = uVar5;
          plVar16 = plVar10;
        }
      }
      for (; lVar14 = (long)plVar9 - (long)base, lVar14 != 0; plVar9 = plVar9 + -1) {
        uVar13 = 1;
        pIVar17 = base;
        while (plVar16 = pIVar17 + uVar13, plVar16 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar16 == plVar9) {
            lVar15 = *plVar9;
            plVar11 = plVar9;
          }
          else {
            lVar18 = *plVar16;
            lVar19 = plVar16[1];
            lVar15 = lVar18;
            if (lVar18 < lVar19) {
              lVar15 = lVar19;
            }
            plVar11 = plVar16 + 1;
            if (lVar19 <= lVar18) {
              plVar11 = plVar16;
            }
            uVar13 = uVar13 | lVar18 < lVar19;
          }
          lVar18 = *pIVar17;
          if (lVar15 <= lVar18) break;
          lVar19 = (long)plVar11 - (long)base;
          *pIVar17 = lVar15;
          lVar15 = (long)pIVar17 - (long)base;
          *plVar11 = lVar18;
          uVar5 = *(undefined8 *)((long)v + lVar15);
          *(undefined8 *)((long)v + lVar15) = *(undefined8 *)((long)v + lVar19);
          *(undefined8 *)((long)v + lVar19) = uVar5;
          uVar5 = *(undefined8 *)((long)i + lVar15);
          *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar19);
          *(undefined8 *)((long)i + lVar19) = uVar5;
          uVar5 = *(undefined8 *)((long)j + lVar15);
          *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar19);
          *(undefined8 *)((long)j + lVar19) = uVar5;
          pIVar17 = plVar11;
        }
        lVar15 = *base;
        *base = *plVar9;
        *plVar9 = lVar15;
        uVar5 = *v;
        *(undefined8 *)v = *(undefined8 *)((long)v + lVar14);
        *(undefined8 *)((long)v + lVar14) = uVar5;
        IVar6 = *i;
        *i = *(Integer *)((long)i + lVar14);
        *(Integer *)((long)i + lVar14) = IVar6;
        IVar6 = *j;
        *j = *(Integer *)((long)j + lVar14);
        *(Integer *)((long)j + lVar14) = IVar6;
      }
    }
    break;
  case 0x3ef:
    uVar13 = *pn;
    if (1 < (long)uVar13) {
      uVar12 = uVar13 >> 1;
      plVar9 = base + uVar12 * 2 + ((ulong)((uint)uVar13 & 1) - 1);
      for (; uVar12 != 1; uVar12 = uVar12 - 1) {
        uVar13 = uVar12;
        plVar16 = base + (uVar12 - 1);
        while (plVar11 = plVar16 + uVar13, plVar11 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar11 == plVar9) {
            lVar14 = *plVar9;
            plVar10 = plVar9;
          }
          else {
            lVar15 = *plVar11;
            lVar18 = plVar11[1];
            lVar14 = lVar15;
            if (lVar15 < lVar18) {
              lVar14 = lVar18;
            }
            plVar10 = plVar11 + 1;
            if (lVar18 <= lVar15) {
              plVar10 = plVar11;
            }
            uVar13 = uVar13 | lVar15 < lVar18;
          }
          lVar15 = *plVar16;
          if (lVar14 <= lVar15) break;
          lVar18 = (long)plVar10 - (long)base;
          *plVar16 = lVar14;
          lVar14 = (long)plVar16 - (long)base;
          *plVar10 = lVar15;
          puVar1 = (undefined8 *)((long)v + lVar14 * 2);
          uVar5 = *puVar1;
          uVar7 = puVar1[1];
          puVar1 = (undefined8 *)((long)v + lVar18 * 2);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)v + lVar14 * 2);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          puVar1 = (undefined8 *)((long)v + lVar18 * 2);
          *puVar1 = uVar5;
          puVar1[1] = uVar7;
          uVar5 = *(undefined8 *)((long)i + lVar14);
          *(undefined8 *)((long)i + lVar14) = *(undefined8 *)((long)i + lVar18);
          *(undefined8 *)((long)i + lVar18) = uVar5;
          uVar5 = *(undefined8 *)((long)j + lVar14);
          *(undefined8 *)((long)j + lVar14) = *(undefined8 *)((long)j + lVar18);
          *(undefined8 *)((long)j + lVar18) = uVar5;
          plVar16 = plVar10;
        }
      }
      for (; lVar14 = (long)plVar9 - (long)base, lVar14 != 0; plVar9 = plVar9 + -1) {
        uVar13 = 1;
        pIVar17 = base;
        while (plVar16 = pIVar17 + uVar13, plVar16 <= plVar9) {
          uVar13 = uVar13 * 2;
          if (plVar16 == plVar9) {
            lVar15 = *plVar9;
            plVar11 = plVar9;
          }
          else {
            lVar18 = *plVar16;
            lVar19 = plVar16[1];
            lVar15 = lVar18;
            if (lVar18 < lVar19) {
              lVar15 = lVar19;
            }
            plVar11 = plVar16 + 1;
            if (lVar19 <= lVar18) {
              plVar11 = plVar16;
            }
            uVar13 = uVar13 | lVar18 < lVar19;
          }
          lVar18 = *pIVar17;
          if (lVar15 <= lVar18) break;
          lVar19 = (long)plVar11 - (long)base;
          *pIVar17 = lVar15;
          lVar15 = (long)pIVar17 - (long)base;
          *plVar11 = lVar18;
          puVar1 = (undefined8 *)((long)v + lVar15 * 2);
          uVar5 = *puVar1;
          uVar7 = puVar1[1];
          puVar1 = (undefined8 *)((long)v + lVar19 * 2);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)v + lVar15 * 2);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          puVar1 = (undefined8 *)((long)v + lVar19 * 2);
          *puVar1 = uVar5;
          puVar1[1] = uVar7;
          uVar5 = *(undefined8 *)((long)i + lVar15);
          *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar19);
          *(undefined8 *)((long)i + lVar19) = uVar5;
          uVar5 = *(undefined8 *)((long)j + lVar15);
          *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar19);
          *(undefined8 *)((long)j + lVar19) = uVar5;
          pIVar17 = plVar11;
        }
        lVar15 = *base;
        *base = *plVar9;
        *plVar9 = lVar15;
        uVar5 = *v;
        uVar7 = *(undefined8 *)((long)v + 8);
        puVar1 = (undefined8 *)((long)v + lVar14 * 2);
        uVar8 = puVar1[1];
        *(undefined8 *)v = *puVar1;
        *(undefined8 *)((long)v + 8) = uVar8;
        puVar1 = (undefined8 *)((long)v + lVar14 * 2);
        *puVar1 = uVar5;
        puVar1[1] = uVar7;
        IVar6 = *i;
        *i = *(Integer *)((long)i + lVar14);
        *(Integer *)((long)i + lVar14) = IVar6;
        IVar6 = *j;
        *j = *(Integer *)((long)j + lVar14);
        *(Integer *)((long)j + lVar14) = IVar6;
      }
    }
  }
  return;
}

Assistant:

void ga_sort_scat(pn, v, i, j, base, type)
     Integer *pn;
     void    *v;
     Integer *i;
     Integer *j;
     Integer *base;
     Integer type;
{ 
   switch (type){
     case C_DBL:  ga_sort_scat_dbl_(pn, (double*)v, i,j,base);break;
     case C_DCPL: ga_sort_scat_dcpl_(pn, (DoubleComplex*)v, i,j,base); break;
     case C_SCPL: ga_sort_scat_scpl_(pn, (SingleComplex*)v, i,j,base); break;
     case C_INT:  ga_sort_scat_int_(pn, (int*)v, i, j, base); break;
     case C_FLOAT:  ga_sort_scat_flt_(pn, (float*)v, i, j, base); break; 
     case C_LONG:  ga_sort_scat_long_(pn, (long*)v, i, j, base); break;
     default:        pnga_error("ERROR:ga_sort_scat: wrong type",type);
   } 
}